

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Class.cpp
# Opt level: O0

void __thiscall Class::addVariable(Class *this,string *varName,Variable *variable)

{
  mapped_type pVVar1;
  bool bVar2;
  int position;
  DuplicateDataMember *this_00;
  mapped_type *ppVVar3;
  string local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_true>
  local_28;
  mapped_type local_20;
  Variable *variable_local;
  string *varName_local;
  Class *this_local;
  
  local_20 = variable;
  variable_local = (Variable *)varName;
  varName_local = (string *)this;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
       ::find(&this->variables,varName);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
       ::end(&this->variables);
  bVar2 = std::__detail::operator!=(&local_28,&local_30);
  pVVar1 = local_20;
  if (!bVar2) {
    ppVVar3 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
              ::operator[](&this->variables,(key_type *)variable_local);
    *ppVVar3 = pVVar1;
    return;
  }
  this_00 = (DuplicateDataMember *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_50,(string *)variable_local);
  position = Variable::getPosition(local_20);
  Semantic::Err::DuplicateDataMember::DuplicateDataMember(this_00,&local_50,position);
  __cxa_throw(this_00,&Semantic::Err::DuplicateDataMember::typeinfo,
              Semantic::Err::DuplicateDataMember::~DuplicateDataMember);
}

Assistant:

void Class::addVariable(const std::string &varName, Variable *variable) {
    if (variables.find(varName) != variables.end())
        throw Semantic::Err::DuplicateDataMember(varName, variable->getPosition());

    variables[varName] = variable;
}